

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerBitwise
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  BinaryOp BVar1;
  TempVar *any;
  Index IVar2;
  Index IVar3;
  pointer this_00;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  LocalGet *pLVar7;
  LocalGet *pLVar8;
  Binary *pBVar9;
  LocalSet *append;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  BinaryOp local_3c;
  TempVar *pTStack_38;
  BinaryOp op32;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  I64ToI32Lowering *pIStack_10;
  BinaryOp op_local;
  I64ToI32Lowering *this_local;
  
  pTStack_38 = rightLow;
  rightLow_local = leftHigh;
  leftHigh_local = leftLow;
  leftLow_local = (TempVar *)result;
  result_local._4_4_ = op;
  pIStack_10 = this;
  if (op == AndInt64) {
    local_3c = AndInt32;
  }
  else if (op == OrInt64) {
    local_3c = OrInt32;
  }
  else {
    if (op != XorInt64) {
      abort();
    }
    local_3c = XorInt32;
  }
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  any = leftLow_local;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = local_3c;
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar3 = TempVar::operator_cast_to_unsigned_int(rightLow_local);
  wasm::Type::Type(&local_48,i32);
  pLVar7 = Builder::makeLocalGet(pBVar6,IVar3,local_48);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  wasm::Type::Type(&local_50,i32);
  pLVar8 = Builder::makeLocalGet(pBVar6,IVar3,local_50);
  pBVar9 = Builder::makeBinary(pBVar5,BVar1,(Expression *)pLVar7,(Expression *)pLVar8);
  append = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)pBVar9);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = local_3c;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh_local);
  wasm::Type::Type(&local_58,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,local_58);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(pTStack_38);
  wasm::Type::Type(&local_60,i32);
  pLVar8 = Builder::makeLocalGet(pBVar5,IVar2,local_60);
  pBVar9 = Builder::makeBinary(pBVar4,BVar1,(Expression *)pLVar7,(Expression *)pLVar8);
  leftLow_local =
       (TempVar *)
       Builder::blockify<wasm::Binary*>(this_00,(Expression *)any,(Expression *)append,pBVar9);
  setOutParam(this,(Expression *)leftLow_local,rightHigh);
  return (Block *)leftLow_local;
}

Assistant:

Block* lowerBitwise(BinaryOp op,
                      Block* result,
                      TempVar&& leftLow,
                      TempVar&& leftHigh,
                      TempVar&& rightLow,
                      TempVar&& rightHigh) {
    BinaryOp op32;
    switch (op) {
      case AndInt64:
        op32 = AndInt32;
        break;
      case OrInt64:
        op32 = OrInt32;
        break;
      case XorInt64:
        op32 = XorInt32;
        break;
      default:
        abort();
    }
    result = builder->blockify(
      result,
      builder->makeLocalSet(
        rightHigh,
        builder->makeBinary(op32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))),
      builder->makeBinary(op32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    setOutParam(result, std::move(rightHigh));
    return result;
  }